

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

LIBSSH2_SFTP * sftp_init(LIBSSH2_SESSION *session)

{
  int iVar1;
  LIBSSH2_CHANNEL *pLVar2;
  ssize_t sVar3;
  size_t local_80;
  size_t data_len_1;
  size_t name_len;
  uchar *extdata;
  uchar *extname;
  uchar *puStack_58;
  int ret;
  uchar *endp;
  string_buf buf;
  LIBSSH2_SFTP *sftp_handle;
  ssize_t rc;
  size_t data_len;
  uchar *data;
  LIBSSH2_SESSION *session_local;
  
  rc = 0;
  data = (uchar *)session;
  if (session->sftpInit_state == libssh2_NB_state_idle) {
    if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
      __assert_fail("!session->sftpInit_sftp",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/sftp.c"
                    ,0x34d,"LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *)");
    }
    session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
    session->sftpInit_state = libssh2_NB_state_created;
  }
  buf.len = (size_t)session->sftpInit_sftp;
  if (session->sftpInit_state == libssh2_NB_state_created) {
    pLVar2 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
    *(LIBSSH2_CHANNEL **)(data + 0x11cd8) = pLVar2;
    if (*(long *)(data + 0x11cd8) == 0) {
      iVar1 = libssh2_session_last_errno((LIBSSH2_SESSION *)data);
      if (iVar1 == -0x25) {
        _libssh2_error((LIBSSH2_SESSION *)data,-0x25,"Would block starting up channel");
      }
      else {
        _libssh2_error((LIBSSH2_SESSION *)data,-0x15,"Unable to startup channel");
        data[0x11cc8] = '\0';
        data[0x11cc9] = '\0';
        data[0x11cca] = '\0';
        data[0x11ccb] = '\0';
      }
      return (LIBSSH2_SFTP *)0x0;
    }
    data[0x11cc8] = '\x03';
    data[0x11cc9] = '\0';
    data[0x11cca] = '\0';
    data[0x11ccb] = '\0';
  }
  if (*(int *)(data + 0x11cc8) == 3) {
    extname._4_4_ =
         _libssh2_channel_process_startup
                   (*(LIBSSH2_CHANNEL **)(data + 0x11cd8),"subsystem",9,"sftp",4);
    if (extname._4_4_ == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)data,-0x25,"Would block to request SFTP subsystem");
      return (LIBSSH2_SFTP *)0x0;
    }
    if (extname._4_4_ != 0) {
      _libssh2_error((LIBSSH2_SESSION *)data,-0x15,"Unable to request SFTP subsystem");
      goto LAB_001358de;
    }
    data[0x11cc8] = '\x04';
    data[0x11cc9] = '\0';
    data[0x11cca] = '\0';
    data[0x11ccb] = '\0';
    extname._4_4_ = 0;
  }
  if (*(int *)(data + 0x11cc8) == 4) {
    iVar1 = _libssh2_channel_extended_data(*(LIBSSH2_CHANNEL **)(data + 0x11cd8),1);
    if (iVar1 == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)data,-0x25,"Would block requesting handle extended data");
      return (LIBSSH2_SFTP *)0x0;
    }
    buf.len = (size_t)_libssh2_calloc((LIBSSH2_SESSION *)data,0x170);
    *(size_t *)(data + 0x11cd0) = buf.len;
    if ((undefined8 *)buf.len == (undefined8 *)0x0) {
      _libssh2_error((LIBSSH2_SESSION *)data,-6,"Unable to allocate a new SFTP structure");
      goto LAB_001358de;
    }
    *(undefined8 *)buf.len = *(undefined8 *)(data + 0x11cd8);
    *(undefined4 *)(buf.len + 8) = 0;
    _libssh2_htonu32(data + 0x11ce0,5);
    data[0x11ce4] = '\x01';
    _libssh2_htonu32(data + 0x11ce5,3);
    data[0x11cf0] = '\0';
    data[0x11cf1] = '\0';
    data[0x11cf2] = '\0';
    data[0x11cf3] = '\0';
    data[0x11cf4] = '\0';
    data[0x11cf5] = '\0';
    data[0x11cf6] = '\0';
    data[0x11cf7] = '\0';
    data[0x11cc8] = '\x05';
    data[0x11cc9] = '\0';
    data[0x11cca] = '\0';
    data[0x11ccb] = '\0';
  }
  if (*(int *)(data + 0x11cc8) == 5) {
    sVar3 = _libssh2_channel_write
                      (*(LIBSSH2_CHANNEL **)(data + 0x11cd8),0,
                       data + *(long *)(data + 0x11cf0) + 0x11ce0,9 - *(long *)(data + 0x11cf0));
    if (sVar3 == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)data,-0x25,"Would block sending SSH_FXP_INIT");
      return (LIBSSH2_SFTP *)0x0;
    }
    if (sVar3 < 0) {
      _libssh2_error((LIBSSH2_SESSION *)data,-7,"Unable to send SSH_FXP_INIT");
      goto LAB_001358de;
    }
    *(ssize_t *)(data + 0x11cf0) = sVar3 + *(long *)(data + 0x11cf0);
    if (*(long *)(data + 0x11cf0) == 9) {
      data[0x11cc8] = '\x06';
      data[0x11cc9] = '\0';
      data[0x11cca] = '\0';
      data[0x11ccb] = '\0';
    }
  }
  if (*(int *)(data + 0x11cc8) == 0x10) {
    iVar1 = _libssh2_channel_free(*(LIBSSH2_CHANNEL **)(data + 0x11cd8));
    if (iVar1 == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)data,-0x25,"Would block closing channel");
      return (LIBSSH2_SFTP *)0x0;
    }
    data[0x11cd8] = '\0';
    data[0x11cd9] = '\0';
    data[0x11cda] = '\0';
    data[0x11cdb] = '\0';
    data[0x11cdc] = '\0';
    data[0x11cdd] = '\0';
    data[0x11cde] = '\0';
    data[0x11cdf] = '\0';
    if (*(long *)(data + 0x11cd0) != 0) {
      (**(code **)(data + 0x18))(*(undefined8 *)(data + 0x11cd0),data);
      data[0x11cd0] = '\0';
      data[0x11cd1] = '\0';
      data[0x11cd2] = '\0';
      data[0x11cd3] = '\0';
      data[0x11cd4] = '\0';
      data[0x11cd5] = '\0';
      data[0x11cd6] = '\0';
      data[0x11cd7] = '\0';
    }
    data[0x11cc8] = '\0';
    data[0x11cc9] = '\0';
    data[0x11cca] = '\0';
    data[0x11ccb] = '\0';
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar1 = sftp_packet_require((LIBSSH2_SFTP *)buf.len,'\x02',0,(uchar **)&data_len,(size_t *)&rc,5);
  if (iVar1 == -0x25) {
    _libssh2_error((LIBSSH2_SESSION *)data,-0x25,"Would block receiving SSH_FXP_VERSION");
    return (LIBSSH2_SFTP *)0x0;
  }
  if (iVar1 == -0x26) {
    if (rc != 0) {
      (**(code **)(data + 0x18))(data_len,data);
    }
    _libssh2_error((LIBSSH2_SESSION *)data,-0x1f,"Invalid SSH_FXP_VERSION response");
  }
  else if (iVar1 == 0) {
    endp = (uchar *)data_len;
    buf.data = (uchar *)(data_len + 1);
    buf.dataptr = (uchar *)rc;
    puStack_58 = (uchar *)(data_len + rc);
    iVar1 = _libssh2_get_u32((string_buf *)&endp,(uint32_t *)(buf.len + 0xc));
    if (iVar1 == 0) {
      if (3 < *(uint *)(buf.len + 0xc)) {
        *(undefined4 *)(buf.len + 0xc) = 3;
      }
      while( true ) {
        if (puStack_58 <= buf.data) {
          (**(code **)(data + 0x18))(data_len,data);
          *(size_t *)(*(long *)buf.len + 0x78) = buf.len;
          *(code **)(*(long *)buf.len + 0x80) = libssh2_sftp_dtor;
          data[0x11cc8] = '\0';
          data[0x11cc9] = '\0';
          data[0x11cca] = '\0';
          data[0x11ccb] = '\0';
          data[0x11cd0] = '\0';
          data[0x11cd1] = '\0';
          data[0x11cd2] = '\0';
          data[0x11cd3] = '\0';
          data[0x11cd4] = '\0';
          data[0x11cd5] = '\0';
          data[0x11cd6] = '\0';
          data[0x11cd7] = '\0';
          data[0x11cd8] = '\0';
          data[0x11cd9] = '\0';
          data[0x11cda] = '\0';
          data[0x11cdb] = '\0';
          data[0x11cdc] = '\0';
          data[0x11cdd] = '\0';
          data[0x11cde] = '\0';
          data[0x11cdf] = '\0';
          _libssh2_list_init((list_head *)(buf.len + 0x38));
          return (LIBSSH2_SFTP *)buf.len;
        }
        iVar1 = _libssh2_get_string((string_buf *)&endp,&extdata,&data_len_1);
        if (iVar1 != 0) break;
        iVar1 = _libssh2_get_string((string_buf *)&endp,(uchar **)&name_len,&local_80);
        if (iVar1 != 0) {
          (**(code **)(data + 0x18))(data_len,data);
          _libssh2_error((LIBSSH2_SESSION *)data,-0x26,"Data too short when extracting extdata");
          goto LAB_001358de;
        }
        register_sftp_extension
                  ((LIBSSH2_SFTP *)buf.len,extdata,data_len_1,(uchar *)name_len,local_80);
      }
      (**(code **)(data + 0x18))(data_len,data);
      _libssh2_error((LIBSSH2_SESSION *)data,-0x26,"Data too short when extracting extname");
    }
    else {
      (**(code **)(data + 0x18))(data_len,data);
    }
  }
  else {
    _libssh2_error((LIBSSH2_SESSION *)data,iVar1,"Timeout waiting for response from SFTP subsystem")
    ;
  }
LAB_001358de:
  data[0x11cc8] = '\x10';
  data[0x11cc9] = '\0';
  data[0x11cca] = '\0';
  data[0x11ccb] = '\0';
  return (LIBSSH2_SFTP *)0x0;
}

Assistant:

static LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *session)
{
    unsigned char *data;
    size_t data_len = 0;
    ssize_t rc;
    LIBSSH2_SFTP *sftp_handle;
    struct string_buf buf;
    unsigned char *endp;

    if(session->sftpInit_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Initializing SFTP subsystem"));

        /*
         * The 'sftpInit_sftp' and 'sftpInit_channel' struct fields within the
         * session struct are only to be used during the setup phase. As soon
         * as the SFTP session is created they are cleared and can thus be
         * re-used again to allow any amount of SFTP handles per sessions.
         *
         * Note that you MUST NOT try to call libssh2_sftp_init() again to get
         * another handle until the previous call has finished and either
         * successfully made a handle or failed and returned error (not
         * including *EAGAIN).
         */

        assert(!session->sftpInit_sftp);
        session->sftpInit_sftp = NULL;
        session->sftpInit_state = libssh2_NB_state_created;
    }

    sftp_handle = session->sftpInit_sftp;

    if(session->sftpInit_state == libssh2_NB_state_created) {
        session->sftpInit_channel =
            _libssh2_channel_open(session, "session", sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL, 0);
        if(!session->sftpInit_channel) {
            if(libssh2_session_last_errno(session) == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block starting up channel");
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_FAILURE,
                               "Unable to startup channel");
                session->sftpInit_state = libssh2_NB_state_idle;
            }
            return NULL;
        }

        session->sftpInit_state = libssh2_NB_state_sent;
    }

    if(session->sftpInit_state == libssh2_NB_state_sent) {
        int ret = _libssh2_channel_process_startup(session->sftpInit_channel,
                                                   "subsystem",
                                                   sizeof("subsystem") - 1,
                                                   "sftp",
                                                   strlen("sftp"));
        if(ret == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block to request SFTP subsystem");
            return NULL;
        }
        else if(ret) {
            _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_FAILURE,
                           "Unable to request SFTP subsystem");
            goto sftp_init_error;
        }

        session->sftpInit_state = libssh2_NB_state_sent1;
    }

    if(session->sftpInit_state == libssh2_NB_state_sent1) {
        rc = _libssh2_channel_extended_data(session->sftpInit_channel,
                                         LIBSSH2_CHANNEL_EXTENDED_DATA_IGNORE);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting handle extended data");
            return NULL;
        }

        sftp_handle =
            session->sftpInit_sftp =
            LIBSSH2_CALLOC(session, sizeof(LIBSSH2_SFTP));
        if(!sftp_handle) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a new SFTP structure");
            goto sftp_init_error;
        }
        sftp_handle->channel = session->sftpInit_channel;
        sftp_handle->request_id = 0;

        _libssh2_htonu32(session->sftpInit_buffer, 5);
        session->sftpInit_buffer[4] = SSH_FXP_INIT;
        _libssh2_htonu32(session->sftpInit_buffer + 5, LIBSSH2_SFTP_VERSION);
        session->sftpInit_sent = 0; /* nothing's sent yet */

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Sending FXP_INIT packet advertising "
                       "version %d support",
                       (int) LIBSSH2_SFTP_VERSION));

        session->sftpInit_state = libssh2_NB_state_sent2;
    }

    if(session->sftpInit_state == libssh2_NB_state_sent2) {
        /* sent off what's left of the init buffer to send */
        rc = _libssh2_channel_write(session->sftpInit_channel, 0,
                                    session->sftpInit_buffer +
                                    session->sftpInit_sent,
                                    9 - session->sftpInit_sent);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending SSH_FXP_INIT");
            return NULL;
        }
        else if(rc < 0) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send SSH_FXP_INIT");
            goto sftp_init_error;
        }
        else {
            /* add up the number of bytes sent */
            session->sftpInit_sent += rc;

            if(session->sftpInit_sent == 9)
                /* move on */
                session->sftpInit_state = libssh2_NB_state_sent3;

            /* if less than 9, we remain in this state to send more later on */
        }
    }

    if(session->sftpInit_state == libssh2_NB_state_error_closing) {
        rc = _libssh2_channel_free(session->sftpInit_channel);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block closing channel");
            return NULL;
        }
        session->sftpInit_channel = NULL;
        if(session->sftpInit_sftp) {
            LIBSSH2_FREE(session, session->sftpInit_sftp);
            session->sftpInit_sftp = NULL;
        }
        session->sftpInit_state = libssh2_NB_state_idle;
        return NULL;
    }

    rc = sftp_packet_require(sftp_handle, SSH_FXP_VERSION,
                             0, &data, &data_len, 5);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                       "Would block receiving SSH_FXP_VERSION");
        return NULL;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                       "Invalid SSH_FXP_VERSION response");
        goto sftp_init_error;
    }
    else if(rc) {
        _libssh2_error(session, (int)rc,
                       "Timeout waiting for response from SFTP subsystem");
        goto sftp_init_error;
    }

    buf.data = data;
    buf.dataptr = buf.data + 1;
    buf.len = data_len;
    endp = &buf.data[data_len];

    if(_libssh2_get_u32(&buf, &(sftp_handle->version))) {
        LIBSSH2_FREE(session, data);
        rc = LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        goto sftp_init_error;
    }

    if(sftp_handle->version > LIBSSH2_SFTP_VERSION) {
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Truncating remote SFTP version from %u",
                       sftp_handle->version));
        sftp_handle->version = LIBSSH2_SFTP_VERSION;
    }
    _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                   "Enabling SFTP version %u compatibility",
                   sftp_handle->version));
    while(buf.dataptr < endp) {
        unsigned char *extname, *extdata;
        size_t name_len, data_len;

        if(_libssh2_get_string(&buf, &extname, &name_len)) {
            LIBSSH2_FREE(session, data);
            _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Data too short when extracting extname");
            goto sftp_init_error;
        }

        if(_libssh2_get_string(&buf, &extdata, &data_len)) {
            LIBSSH2_FREE(session, data);
            _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Data too short when extracting extdata");
            goto sftp_init_error;
        }

        register_sftp_extension(sftp_handle, extname, name_len, 
                                extdata, data_len);
    }
    LIBSSH2_FREE(session, data);

    /* Make sure that when the channel gets closed, the SFTP service is shut
       down too */
    sftp_handle->channel->abstract = sftp_handle;
    sftp_handle->channel->close_cb = libssh2_sftp_dtor;

    session->sftpInit_state = libssh2_NB_state_idle;

    /* clear the sftp and channel pointers in this session struct now */
    session->sftpInit_sftp = NULL;
    session->sftpInit_channel = NULL;

    _libssh2_list_init(&sftp_handle->sftp_handles);

    return sftp_handle;

sftp_init_error:
    session->sftpInit_state = libssh2_NB_state_error_closing;
    return NULL;
}